

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.hpp
# Opt level: O2

nanoseconds binlog::clockSinceEpoch(void)

{
  timespec ts;
  timespec local_18;
  
  local_18.tv_sec = 0;
  local_18.tv_nsec = 0;
  clock_gettime(0,&local_18);
  return (nanoseconds)(local_18.tv_sec * 1000000000 + local_18.tv_nsec);
}

Assistant:

clockSinceEpoch()
{
  // Depending on how libstdc++ is built (_GLIBCXX_USE_CLOCK_GETTIME_SYSCALL),
  // system_clock::now() can result in a clock_gettime syscall,
  // which is really slow compared to the vsyscall equivalent.
  // Call clock_gettime unconditionally on linux:
  #ifdef __linux__
    struct timespec ts{};
    clock_gettime(CLOCK_REALTIME, &ts);
    return std::chrono::nanoseconds{
      std::chrono::seconds{ts.tv_sec} + std::chrono::nanoseconds{ts.tv_nsec}
    };
  #else
    return std::chrono::system_clock::now().time_since_epoch();
  #endif
}